

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

reference andres::marray_detail::AccessOperatorHelper<true>::
          execute<TestType,int,true,std::allocator<unsigned_long>>
                    (View<TestType,_true,_std::allocator<unsigned_long>_> *v,int *index)

{
  size_t in_RAX;
  runtime_error *this;
  size_t offset;
  size_t local_18;
  
  local_18 = in_RAX;
  View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant(v);
  if (v->data_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
  }
  else {
    if (*index == 0 || (v->geometry_).dimension_ != 0) {
      View<TestType,_true,_std::allocator<unsigned_long>_>::indexToOffset(v,(long)*index,&local_18);
      return v->data_ + local_18;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static typename View<T, isConst, A>::reference
    execute(const View<T, isConst, A>& v, const U& index)
    {
        v.testInvariant();
        Assert(MARRAY_NO_DEBUG || v.data_ != 0);
        Assert(MARRAY_NO_DEBUG || v.dimension() != 0 || index == 0);
        std::size_t offset;
        v.indexToOffset(index, offset);
        return v.data_[offset];
    }